

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

S1Angle __thiscall S2Builder::SnapFunction::max_edge_deviation(SnapFunction *this)

{
  bool bVar1;
  ostream *poVar2;
  double extraout_XMM0_Qa;
  S1Angle a;
  S1Angle SVar3;
  double kMaxEdgeDeviationRatio;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  double local_28;
  S1Angle local_20;
  SnapFunction *local_18;
  SnapFunction *this_local;
  
  local_18 = this;
  (*this->_vptr_SnapFunction[2])();
  local_20.radians_ = extraout_XMM0_Qa;
  local_28 = (double)kMaxSnapRadius();
  bVar1 = operator<=(local_20,(S1Angle)local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    (*this->_vptr_SnapFunction[2])();
    SVar3 = ::operator*(1.1,a);
    return (S1Angle)SVar3.radians_;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x85,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_40);
  poVar2 = std::operator<<(poVar2,"Check failed: (snap_radius()) <= (kMaxSnapRadius()) ");
  S2LogMessageVoidify::operator&(&local_29,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
}

Assistant:

S1Angle S2Builder::SnapFunction::max_edge_deviation() const {
  // We want max_edge_deviation() to be large enough compared to snap_radius()
  // such that edge splitting is rare.
  //
  // Using spherical trigonometry, if the endpoints of an edge of length L
  // move by at most a distance R, the center of the edge moves by at most
  // asin(sin(R) / cos(L / 2)).  Thus the (max_edge_deviation / snap_radius)
  // ratio increases with both the snap radius R and the edge length L.
  //
  // We arbitrarily limit the edge deviation to be at most 10% more than the
  // snap radius.  With the maximum allowed snap radius of 70 degrees, this
  // means that edges up to 30.6 degrees long are never split.  For smaller
  // snap radii, edges up to 49 degrees long are never split.  (Edges of any
  // length are not split unless their endpoints move far enough so that the
  // actual edge deviation exceeds the limit; in practice, splitting is rare
  // even with long edges.)  Note that it is always possible to split edges
  // when max_edge_deviation() is exceeded; see MaybeAddExtraSites().
  S2_DCHECK_LE(snap_radius(), kMaxSnapRadius());
  const double kMaxEdgeDeviationRatio = 1.1;
  return kMaxEdgeDeviationRatio * snap_radius();
}